

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O0

void __thiscall FIX::message_order::message_order(message_order *this,message_order *copy)

{
  message_order *copy_local;
  message_order *this_local;
  
  shared_array<int>::shared_array(&this->m_groupOrder);
  operator=(this,copy);
  return;
}

Assistant:

message_order( const message_order& copy ) 
  { *this = copy; }